

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void init_proc_401(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict3 *__mptr;
  
  gen_spr_40x(env);
  gen_spr_401_403(env);
  gen_spr_401(env);
  env->excp_vectors[0] = 0x100;
  env->excp_vectors[1] = 0x200;
  env->excp_vectors[4] = 0x500;
  env->excp_vectors[5] = 0x600;
  env->excp_vectors[6] = 0x700;
  env->excp_vectors[8] = 0xc00;
  env->excp_vectors[0x4a] = 0x1000;
  env->excp_vectors[0xb] = 0x1010;
  env->excp_vectors[0xc] = 0x1020;
  env->excp_vectors[0xf] = 0x2000;
  env->ivor_mask = 0xfff0;
  env->ivpr_mask = 0xffff0000;
  env->hreset_vector = 0xfffffffc;
  env->dcache_line_size = 0x20;
  env->icache_line_size = 0x20;
  ppc40x_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
  builtin_memcpy(env->fit_period,"\f\x10\x14\x18",4);
  builtin_memcpy(env->wdt_period,"\x10\x14\x18\x1c",4);
  return;
}

Assistant:

static void init_proc_401(CPUPPCState *env)
{
    gen_spr_40x(env);
    gen_spr_401_403(env);
    gen_spr_401(env);
    init_excp_4xx_real(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc40x_irq_init(env_archcpu(env));

    SET_FIT_PERIOD(12, 16, 20, 24);
    SET_WDT_PERIOD(16, 20, 24, 28);
}